

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PopClipRect(void)

{
  ImVec4 *pIVar1;
  ImGuiWindow *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  ImDrawList::PopClipRect(pIVar2->DrawList);
  pIVar1 = (pIVar2->DrawList->_ClipRectStack).Data +
           (long)(pIVar2->DrawList->_ClipRectStack).Size + -1;
  fVar3 = pIVar1->y;
  fVar4 = pIVar1->z;
  fVar5 = pIVar1->w;
  (pIVar2->ClipRect).Min.x = pIVar1->x;
  (pIVar2->ClipRect).Min.y = fVar3;
  (pIVar2->ClipRect).Max.x = fVar4;
  (pIVar2->ClipRect).Max.y = fVar5;
  return;
}

Assistant:

void ImGuiListClipper::ForceDisplayRangeByIndices(int item_min, int item_max)
{
    ImGuiListClipperData* data = (ImGuiListClipperData*)TempData;
    IM_ASSERT(DisplayStart < 0); // Only allowed after Begin() and if there has not been a specified range yet.
    IM_ASSERT(item_min <= item_max);
    if (item_min < item_max)
        data->Ranges.push_back(ImGuiListClipperRange::FromIndices(item_min, item_max));
}